

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackDebGenerator.cxx
# Opt level: O0

int __thiscall cmCPackDebGenerator::createDeb(cmCPackDebGenerator *this)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  ostream *poVar6;
  unsigned_long uVar7;
  ulong uVar8;
  void *pvVar9;
  pointer pbVar10;
  char *pcVar11;
  string *psVar12;
  reference pbVar13;
  reference pbVar14;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar15;
  undefined1 local_2518 [8];
  cmGeneratedFileStream ofs_2;
  string local_22c8;
  string local_22a8 [8];
  string tmpFile_2;
  string local_2280;
  allocator local_225a;
  allocator local_2259;
  string local_2258;
  string local_2238 [8];
  string outputFileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21b8;
  allocator local_2192;
  allocator local_2191;
  string local_2190;
  undefined1 local_2170 [8];
  string topLevelString;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  arFiles;
  undefined1 local_2118 [8];
  ostringstream cmCPackLog_msg_6;
  undefined1 local_1fa0 [8];
  cmGeneratedFileStream ofs_1;
  string local_1d50;
  string local_1d30 [8];
  string tmpFile_1;
  string local_1d08;
  allocator local_1ce2;
  allocator local_1ce1;
  string local_1ce0;
  undefined1 local_1cc0 [8];
  string localcopy;
  string filenamename;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1c78;
  iterator i;
  string local_1c68;
  undefined1 local_1c48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  controlExtraList;
  string local_1c28;
  char *local_1c08;
  char *controlExtra;
  allocator local_1bd9;
  string local_1bd8;
  string local_1bb8 [32];
  undefined1 local_1b98 [8];
  ostringstream cmCPackLog_msg_5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a20;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a18;
  undefined8 local_1a10;
  allocator local_1a02;
  allocator local_1a01;
  string local_1a00;
  string local_19e0 [8];
  string topLevelWithTrailingSlash;
  const_iterator fileIt_2;
  cmGeneratedFileStream out_2;
  string local_1768;
  string local_1748 [8];
  string md5filename;
  string local_1720 [32];
  undefined1 local_1700 [8];
  ostringstream cmCPackLog_msg_4;
  undefined1 local_1588 [8];
  cmGeneratedFileStream ofs;
  string local_1338;
  string local_1318 [8];
  string tmpFile;
  string local_12f0;
  uint local_12d0;
  int local_12cc;
  int res;
  int retval;
  string output;
  _Self local_1298;
  _Self local_1290;
  string local_1288 [32];
  undefined1 local_1268 [8];
  ostringstream cmCPackLog_msg_3;
  undefined1 local_10f0 [8];
  string relativeDir;
  size_type slashPos;
  undefined1 local_10a8 [8];
  ostringstream cmCPackLog_msg_2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f30;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f28;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f20;
  const_iterator fileIt_1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  installDirs;
  allocator local_ec1;
  string local_ec0;
  undefined1 local_ea0 [8];
  ostringstream cmCPackLog_msg_1;
  allocator local_d22;
  allocator local_d21;
  string local_d20;
  string local_d00 [32];
  ulong local_ce0;
  size_t topLevelLength;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_cb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c78;
  string local_c58 [32];
  undefined1 local_c38 [8];
  ostringstream cmCPackLog_msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ac0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_aa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a20;
  undefined1 local_a00 [8];
  string compression_suffix;
  undefined1 local_9d8 [8];
  string compression_modifier;
  undefined1 local_9b0 [8];
  string cmake_tar;
  string local_988;
  char *local_968;
  char *debian_compression_type;
  string local_958;
  string local_938 [8];
  string cmd;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_910;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_908;
  const_iterator fileIt;
  string local_8f8;
  string local_8d8 [8];
  string dirName;
  unsigned_long totalSize;
  cmGeneratedFileStream out_1;
  string local_660;
  char *local_640;
  char *debian_pkg_replaces;
  string local_630;
  char *local_610;
  char *debian_pkg_provides;
  string local_600;
  char *local_5e0;
  char *debian_pkg_conflicts;
  string local_5d0;
  char *local_5b0;
  char *debian_pkg_breaks;
  string local_5a0;
  char *local_580;
  char *debian_pkg_enhances;
  string local_570;
  char *local_550;
  char *debian_pkg_predep;
  string local_540;
  char *local_520;
  char *debian_pkg_url;
  string local_510;
  char *local_4f0;
  char *debian_pkg_sug;
  string local_4e0;
  char *local_4c0;
  char *debian_pkg_rec;
  string local_4b0;
  char *local_490;
  char *debian_pkg_dep;
  string local_480;
  char *local_460;
  char *desc;
  string local_450;
  char *local_430;
  char *maintainer;
  string local_420;
  char *local_400;
  char *debian_pkg_arch;
  string local_3f0;
  char *local_3d0;
  char *debian_pkg_priority;
  string local_3c0;
  char *local_3a0;
  char *debian_pkg_section;
  string local_390;
  char *local_370;
  char *debian_pkg_version;
  string local_360;
  string local_340;
  undefined1 local_320 [8];
  string debian_pkg_name;
  string local_2f8;
  string local_2d8 [8];
  string ctlfilename;
  cmGeneratedFileStream out;
  allocator local_59;
  string local_58;
  string local_38 [8];
  string dbfilename;
  cmCPackDebGenerator *this_local;
  
  dbfilename.field_2._8_8_ = this;
  std::__cxx11::string::string(local_38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"GEN_WDIR",&local_59);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_58);
  std::__cxx11::string::operator+=(local_38,pcVar5);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::operator+=(local_38,"/debian-binary");
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&ctlfilename.field_2 + 8),pcVar5,false);
  std::operator<<((ostream *)((long)&ctlfilename.field_2 + 8),"2.0");
  std::ostream::operator<<
            ((void *)((long)&ctlfilename.field_2 + 8),std::endl<char,std::char_traits<char>>);
  cmGeneratedFileStream::~cmGeneratedFileStream
            ((cmGeneratedFileStream *)((long)&ctlfilename.field_2 + 8));
  std::__cxx11::string::string(local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2f8,"GEN_WDIR",
             (allocator *)(debian_pkg_name.field_2._M_local_buf + 0xf));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2f8);
  std::__cxx11::string::operator=(local_2d8,pcVar5);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator((allocator<char> *)(debian_pkg_name.field_2._M_local_buf + 0xf));
  std::__cxx11::string::operator+=(local_2d8,"/control");
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_360,"GEN_CPACK_DEBIAN_PACKAGE_NAME",
             (allocator *)((long)&debian_pkg_version + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_360);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_340,pcVar5,(allocator *)((long)&debian_pkg_version + 6));
  cmsys::SystemTools::LowerCase((string *)local_320,&local_340);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_version + 6));
  std::__cxx11::string::~string((string *)&local_360);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_version + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_390,"GEN_CPACK_DEBIAN_PACKAGE_VERSION",
             (allocator *)((long)&debian_pkg_section + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_390);
  std::__cxx11::string::~string((string *)&local_390);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_section + 7));
  local_370 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3c0,"GEN_CPACK_DEBIAN_PACKAGE_SECTION",
             (allocator *)((long)&debian_pkg_priority + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3c0);
  std::__cxx11::string::~string((string *)&local_3c0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_priority + 7));
  local_3a0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_3f0,"GEN_CPACK_DEBIAN_PACKAGE_PRIORITY",
             (allocator *)((long)&debian_pkg_arch + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_3f0);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_arch + 7));
  local_3d0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_420,"GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE",
             (allocator *)((long)&maintainer + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator((allocator<char> *)((long)&maintainer + 7));
  local_400 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_450,"GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER",
             (allocator *)((long)&desc + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_450);
  std::__cxx11::string::~string((string *)&local_450);
  std::allocator<char>::~allocator((allocator<char> *)((long)&desc + 7));
  local_430 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_480,"GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION",
             (allocator *)((long)&debian_pkg_dep + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_480);
  std::__cxx11::string::~string((string *)&local_480);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_dep + 7));
  local_460 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4b0,"GEN_CPACK_DEBIAN_PACKAGE_DEPENDS",
             (allocator *)((long)&debian_pkg_rec + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4b0);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_rec + 7));
  local_490 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4e0,"GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS",
             (allocator *)((long)&debian_pkg_sug + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_4e0);
  std::__cxx11::string::~string((string *)&local_4e0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_sug + 7));
  local_4c0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_510,"GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS",
             (allocator *)((long)&debian_pkg_url + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_url + 7));
  local_4f0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_540,"GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE",
             (allocator *)((long)&debian_pkg_predep + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_540);
  std::__cxx11::string::~string((string *)&local_540);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_predep + 7));
  local_520 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_570,"GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS",
             (allocator *)((long)&debian_pkg_enhances + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_570);
  std::__cxx11::string::~string((string *)&local_570);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_enhances + 7));
  local_550 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5a0,"GEN_CPACK_DEBIAN_PACKAGE_ENHANCES",
             (allocator *)((long)&debian_pkg_breaks + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_5a0);
  std::__cxx11::string::~string((string *)&local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_breaks + 7));
  local_580 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_5d0,"GEN_CPACK_DEBIAN_PACKAGE_BREAKS",
             (allocator *)((long)&debian_pkg_conflicts + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_5d0);
  std::__cxx11::string::~string((string *)&local_5d0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_conflicts + 7));
  local_5b0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_600,"GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS",
             (allocator *)((long)&debian_pkg_provides + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_provides + 7));
  local_5e0 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_630,"GEN_CPACK_DEBIAN_PACKAGE_PROVIDES",
             (allocator *)((long)&debian_pkg_replaces + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_630);
  std::__cxx11::string::~string((string *)&local_630);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_pkg_replaces + 7));
  local_610 = pcVar5;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_660,"GEN_CPACK_DEBIAN_PACKAGE_REPLACES",
             (allocator *)&out_1.field_0x247);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_660);
  std::__cxx11::string::~string((string *)&local_660);
  std::allocator<char>::~allocator((allocator<char> *)&out_1.field_0x247);
  local_640 = pcVar5;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&totalSize,pcVar5,false);
  poVar6 = std::operator<<((ostream *)&totalSize,"Package: ");
  poVar6 = std::operator<<(poVar6,(string *)local_320);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Version: ");
  poVar6 = std::operator<<(poVar6,local_370);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Section: ");
  poVar6 = std::operator<<(poVar6,local_3a0);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Priority: ");
  poVar6 = std::operator<<(poVar6,local_3d0);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Architecture: ");
  poVar6 = std::operator<<(poVar6,local_400);
  std::operator<<(poVar6,"\n");
  if ((local_490 != (char *)0x0) && (*local_490 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Depends: ");
    poVar6 = std::operator<<(poVar6,local_490);
    std::operator<<(poVar6,"\n");
  }
  if ((local_4c0 != (char *)0x0) && (*local_4c0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Recommends: ");
    poVar6 = std::operator<<(poVar6,local_4c0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_4f0 != (char *)0x0) && (*local_4f0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Suggests: ");
    poVar6 = std::operator<<(poVar6,local_4f0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_520 != (char *)0x0) && (*local_520 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Homepage: ");
    poVar6 = std::operator<<(poVar6,local_520);
    std::operator<<(poVar6,"\n");
  }
  if ((local_550 != (char *)0x0) && (*local_550 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Pre-Depends: ");
    poVar6 = std::operator<<(poVar6,local_550);
    std::operator<<(poVar6,"\n");
  }
  if ((local_580 != (char *)0x0) && (*local_580 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Enhances: ");
    poVar6 = std::operator<<(poVar6,local_580);
    std::operator<<(poVar6,"\n");
  }
  if ((local_5b0 != (char *)0x0) && (*local_5b0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Breaks: ");
    poVar6 = std::operator<<(poVar6,local_5b0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_5e0 != (char *)0x0) && (*local_5e0 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Conflicts: ");
    poVar6 = std::operator<<(poVar6,local_5e0);
    std::operator<<(poVar6,"\n");
  }
  if ((local_610 != (char *)0x0) && (*local_610 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Provides: ");
    poVar6 = std::operator<<(poVar6,local_610);
    std::operator<<(poVar6,"\n");
  }
  if ((local_640 != (char *)0x0) && (*local_640 != '\0')) {
    poVar6 = std::operator<<((ostream *)&totalSize,"Replaces: ");
    poVar6 = std::operator<<(poVar6,local_640);
    std::operator<<(poVar6,"\n");
  }
  dirName.field_2._8_8_ = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_8f8,"CPACK_TEMPORARY_DIRECTORY",
             (allocator *)((long)&fileIt._M_current + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_8f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_8d8,pcVar5,(allocator *)((long)&fileIt._M_current + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 6));
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator((allocator<char> *)((long)&fileIt._M_current + 7));
  std::__cxx11::string::operator+=(local_8d8,'/');
  local_910._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->packageFiles);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_908,&local_910);
  while( true ) {
    cmd.field_2._8_8_ =
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->packageFiles);
    bVar2 = __gnu_cxx::operator!=
                      (&local_908,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)((long)&cmd.field_2 + 8));
    if (!bVar2) break;
    pbVar13 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_908);
    uVar7 = cmsys::SystemTools::FileLength(pbVar13);
    dirName.field_2._8_8_ = uVar7 + dirName.field_2._8_8_;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_908);
  }
  std::__cxx11::string::~string(local_8d8);
  poVar6 = std::operator<<((ostream *)&totalSize,"Installed-Size: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,dirName.field_2._8_8_ + 0x3ff >> 10);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Maintainer: ");
  poVar6 = std::operator<<(poVar6,local_430);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&totalSize,"Description: ");
  poVar6 = std::operator<<(poVar6,local_460);
  std::operator<<(poVar6,"\n");
  std::ostream::operator<<(&totalSize,std::endl<char,std::char_traits<char>>);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&totalSize);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_958,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE",
             (allocator *)((long)&debian_compression_type + 7));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_958);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_938,pcVar5,(allocator *)((long)&debian_compression_type + 6));
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_compression_type + 6));
  std::__cxx11::string::~string((string *)&local_958);
  std::allocator<char>::~allocator((allocator<char> *)((long)&debian_compression_type + 7));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_988,"GEN_CPACK_DEBIAN_COMPRESSION_TYPE",
             (allocator *)(cmake_tar.field_2._M_local_buf + 0xf));
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_988);
  std::__cxx11::string::~string((string *)&local_988);
  std::allocator<char>::~allocator((allocator<char> *)(cmake_tar.field_2._M_local_buf + 0xf));
  local_968 = pcVar5;
  if (pcVar5 == (char *)0x0) {
    local_968 = "gzip";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_9b0," ",(allocator *)(compression_modifier.field_2._M_local_buf + 0xf))
  ;
  std::allocator<char>::~allocator
            ((allocator<char> *)(compression_modifier.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_9d8,"a",(allocator *)(compression_suffix.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(compression_suffix.field_2._M_local_buf + 0xf));
  std::__cxx11::string::string((string *)local_a00);
  iVar3 = strcmp(local_968,"lzma");
  if (iVar3 == 0) {
    std::__cxx11::string::operator=((string *)local_a00,".lzma");
  }
  else {
    iVar3 = strcmp(local_968,"xz");
    if (iVar3 == 0) {
      std::__cxx11::string::operator=((string *)local_a00,".xz");
    }
    else {
      iVar3 = strcmp(local_968,"bzip2");
      if (iVar3 == 0) {
        std::__cxx11::string::operator=((string *)local_a00,".bz2");
        std::__cxx11::string::operator=((string *)local_9d8,"j");
        psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
        std::operator+(&local_a40,"\"",psVar12);
        std::operator+(&local_a20,&local_a40,"\" -E ");
        std::__cxx11::string::operator+=((string *)local_9b0,(string *)&local_a20);
        std::__cxx11::string::~string((string *)&local_a20);
        std::__cxx11::string::~string((string *)&local_a40);
      }
      else {
        iVar3 = strcmp(local_968,"gzip");
        if (iVar3 == 0) {
          std::__cxx11::string::operator=((string *)local_a00,".gz");
          std::__cxx11::string::operator=((string *)local_9d8,"z");
          psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
          std::operator+(&local_a80,"\"",psVar12);
          std::operator+(&local_a60,&local_a80,"\" -E ");
          std::__cxx11::string::operator+=((string *)local_9b0,(string *)&local_a60);
          std::__cxx11::string::~string((string *)&local_a60);
          std::__cxx11::string::~string((string *)&local_a80);
        }
        else {
          iVar3 = strcmp(local_968,"none");
          if (iVar3 == 0) {
            std::__cxx11::string::operator=((string *)local_a00,"");
            std::__cxx11::string::operator=((string *)local_9d8,"");
            psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
            std::operator+(&local_ac0,"\"",psVar12);
            std::operator+(&local_aa0,&local_ac0,"\" -E ");
            std::__cxx11::string::operator+=((string *)local_9b0,(string *)&local_aa0);
            std::__cxx11::string::~string((string *)&local_aa0);
            std::__cxx11::string::~string((string *)&local_ac0);
          }
          else {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c38);
            poVar6 = std::operator<<((ostream *)local_c38,"Error unrecognized compression type: ");
            poVar6 = std::operator<<(poVar6,local_968);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            pcVar1 = (this->super_cmCPackGenerator).Logger;
            std::__cxx11::ostringstream::str();
            pcVar5 = (char *)std::__cxx11::string::c_str();
            cmCPackLog::Log(pcVar1,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                            ,0x1b1,pcVar5);
            std::__cxx11::string::~string(local_c58);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c38);
          }
        }
      }
    }
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &topLevelLength,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b0,
                 "tar c");
  std::operator+(&local_cb8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &topLevelLength,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9d8);
  std::operator+(&local_c98,&local_cb8,"f data.tar");
  std::operator+(&local_c78,&local_c98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00);
  std::__cxx11::string::operator+=(local_938,(string *)&local_c78);
  std::__cxx11::string::~string((string *)&local_c78);
  std::__cxx11::string::~string((string *)&local_c98);
  std::__cxx11::string::~string((string *)&local_cb8);
  std::__cxx11::string::~string((string *)&topLevelLength);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d20,"GEN_WDIR",&local_d21);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_d20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d00,pcVar5,&local_d22);
  uVar8 = std::__cxx11::string::length();
  std::__cxx11::string::~string(local_d00);
  std::allocator<char>::~allocator((allocator<char> *)&local_d22);
  std::__cxx11::string::~string((string *)&local_d20);
  std::allocator<char>::~allocator((allocator<char> *)&local_d21);
  local_ce0 = uVar8;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ea0);
  poVar6 = std::operator<<((ostream *)local_ea0,"WDIR: \"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_ec0,"GEN_WDIR",&local_ec1);
  pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_ec0);
  poVar6 = std::operator<<(poVar6,pcVar5);
  poVar6 = std::operator<<(poVar6,"\", length = ");
  pvVar9 = (void *)std::ostream::operator<<(poVar6,local_ce0);
  std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_ec0);
  std::allocator<char>::~allocator((allocator<char> *)&local_ec1);
  pcVar1 = (this->super_cmCPackGenerator).Logger;
  std::__cxx11::ostringstream::str();
  pcVar5 = (char *)std::__cxx11::string::c_str();
  cmCPackLog::Log(pcVar1,4,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                  ,0x1be,pcVar5);
  std::__cxx11::string::~string
            ((string *)&installDirs._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ea0);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&fileIt_1);
  local_f28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(&this->packageFiles);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_f20,&local_f28);
  while( true ) {
    local_f30._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&this->packageFiles);
    bVar2 = __gnu_cxx::operator!=(&local_f20,&local_f30);
    if (!bVar2) break;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_10a8);
    poVar6 = std::operator<<((ostream *)local_10a8,"FILEIT: \"");
    pbVar13 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&local_f20);
    poVar6 = std::operator<<(poVar6,(string *)pbVar13);
    poVar6 = std::operator<<(poVar6,"\"");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1c5,pcVar5);
    std::__cxx11::string::~string((string *)&slashPos);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_10a8);
    pbVar10 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_f20);
    relativeDir.field_2._8_8_ = std::__cxx11::string::find((char)pbVar10,0x2f);
    pbVar10 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_f20);
    std::__cxx11::string::substr((ulong)local_10f0,(ulong)pbVar10);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1268);
    poVar6 = std::operator<<((ostream *)local_1268,"RELATIVEDIR: \"");
    poVar6 = std::operator<<(poVar6,(string *)local_10f0);
    poVar6 = std::operator<<(poVar6,"\"");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1ca,pcVar5);
    std::__cxx11::string::~string(local_1288);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1268);
    local_1290._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&fileIt_1,(key_type *)local_10f0);
    local_1298._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&fileIt_1);
    bVar2 = std::operator==(&local_1290,&local_1298);
    if (bVar2) {
      pVar15 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&fileIt_1,(value_type *)local_10f0);
      output.field_2._8_8_ = pVar15.first._M_node;
      std::__cxx11::string::operator+=(local_938," .");
      std::__cxx11::string::operator+=(local_938,(string *)local_10f0);
    }
    std::__cxx11::string::~string((string *)local_10f0);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_f20);
  }
  std::__cxx11::string::string((string *)&res);
  local_12cc = -1;
  pcVar5 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_12f0,"GEN_WDIR",(allocator *)(tmpFile.field_2._M_local_buf + 0xf));
  pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_12f0);
  bVar2 = cmSystemTools::RunSingleCommand
                    (pcVar5,(string *)&res,(string *)&res,&local_12cc,pcVar11,
                     (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
  uVar4 = (uint)bVar2;
  std::__cxx11::string::~string((string *)&local_12f0);
  std::allocator<char>::~allocator((allocator<char> *)(tmpFile.field_2._M_local_buf + 0xf));
  local_12d0 = uVar4;
  if ((uVar4 == 0) || (local_12cc != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1338,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&ofs.field_0x247);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1338);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1318,pcVar5,(allocator *)&ofs.field_0x246);
    std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x246);
    std::__cxx11::string::~string((string *)&local_1338);
    std::allocator<char>::~allocator((allocator<char> *)&ofs.field_0x247);
    std::__cxx11::string::operator+=(local_1318,"/Deb.log");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1588,pcVar5,false);
    poVar6 = std::operator<<((ostream *)local_1588,"# Run command: ");
    poVar6 = std::operator<<(poVar6,local_938);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"# Working directory: ");
    poVar6 = std::operator<<(poVar6,(string *)&(this->super_cmCPackGenerator).toplevel);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"# Output:");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,(string *)&res);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1700);
    poVar6 = std::operator<<((ostream *)local_1700,"Problem running tar command: ");
    poVar6 = std::operator<<(poVar6,local_938);
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(poVar6,"Please check ");
    poVar6 = std::operator<<(poVar6,local_1318);
    poVar6 = std::operator<<(poVar6," for errors");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    pcVar1 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::ostringstream::str();
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmCPackLog::Log(pcVar1,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                    ,0x1e3,pcVar5);
    std::__cxx11::string::~string(local_1720);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1700);
    this_local._4_4_ = 0;
    md5filename.field_2._12_4_ = 1;
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1588);
    std::__cxx11::string::~string(local_1318);
  }
  else {
    std::__cxx11::string::string(local_1748);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1768,"GEN_WDIR",(allocator *)&out_2.field_0x247);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1768);
    std::__cxx11::string::operator=(local_1748,pcVar5);
    std::__cxx11::string::~string((string *)&local_1768);
    std::allocator<char>::~allocator((allocator<char> *)&out_2.field_0x247);
    std::__cxx11::string::operator+=(local_1748,"/md5sums");
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)&fileIt_2,pcVar5,false);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)((long)&topLevelWithTrailingSlash.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_1a00,"CPACK_TEMPORARY_DIRECTORY",&local_1a01);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1a00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_19e0,pcVar5,&local_1a02);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a02);
    std::__cxx11::string::~string((string *)&local_1a00);
    std::allocator<char>::~allocator((allocator<char> *)&local_1a01);
    std::__cxx11::string::operator+=(local_19e0,'/');
    local_1a18._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&this->packageFiles);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_1a10,&local_1a18);
    topLevelWithTrailingSlash.field_2._8_8_ = local_1a10;
    while( true ) {
      local_1a20._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(&this->packageFiles);
      bVar2 = __gnu_cxx::operator!=
                        ((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&topLevelWithTrailingSlash.field_2 + 8),&local_1a20);
      if (!bVar2) break;
      std::__cxx11::string::operator=(local_938,"\"");
      psVar12 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
      std::__cxx11::string::operator+=(local_938,(string *)psVar12);
      std::__cxx11::string::operator+=(local_938,"\" -E md5sum \"");
      pbVar13 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)((long)&topLevelWithTrailingSlash.field_2 + 8));
      std::__cxx11::string::operator+=(local_938,(string *)pbVar13);
      std::__cxx11::string::operator+=(local_938,"\"");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      pcVar11 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmSystemTools::RunSingleCommand
                        (pcVar5,(string *)&res,(string *)&res,&local_12cc,pcVar11,
                         (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
      local_12d0 = (uint)bVar2;
      if ((local_12d0 == 0) || (local_12cc != 0)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b98);
        poVar6 = std::operator<<((ostream *)local_1b98,"Problem running cmake -E md5sum ");
        poVar6 = std::operator<<(poVar6,local_938);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        pcVar1 = (this->super_cmCPackGenerator).Logger;
        std::__cxx11::ostringstream::str();
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmCPackLog::Log(pcVar1,0x10,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                        ,0x201,pcVar5);
        std::__cxx11::string::~string(local_1bb8);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b98);
      }
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmsys::SystemTools::ReplaceString((string *)&res,pcVar5,"");
      std::operator<<((ostream *)&fileIt_2,(string *)&res);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++((__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)((long)&topLevelWithTrailingSlash.field_2 + 8));
    }
    std::__cxx11::string::~string(local_19e0);
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)&fileIt_2);
    pcVar5 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::SetPermissions(pcVar5,0x1a4);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1bd8,"GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE",&local_1bd9);
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1bd8);
    std::__cxx11::string::operator=(local_938,pcVar5);
    std::__cxx11::string::~string((string *)&local_1bd8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1bd9);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &controlExtra,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_9b0,
                   "tar czf control.tar.gz ./control ./md5sums");
    std::__cxx11::string::operator+=(local_938,(string *)&controlExtra);
    std::__cxx11::string::~string((string *)&controlExtra);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1c28,"GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA",
               (allocator *)
               ((long)&controlExtraList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1c28);
    std::__cxx11::string::~string((string *)&local_1c28);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&controlExtraList.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    local_1c08 = pcVar5;
    if (pcVar5 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_1c48);
      pcVar5 = local_1c08;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1c68,pcVar5,(allocator *)((long)&i._M_current + 7));
      cmSystemTools::ExpandListArgument
                (&local_1c68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_1c48,false);
      std::__cxx11::string::~string((string *)&local_1c68);
      std::allocator<char>::~allocator((allocator<char> *)((long)&i._M_current + 7));
      local_1c78._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c48);
      while( true ) {
        filenamename.field_2._8_8_ =
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_1c48);
        bVar2 = __gnu_cxx::operator!=
                          (&local_1c78,
                           (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)((long)&filenamename.field_2 + 8));
        if (!bVar2) break;
        pbVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1c78);
        cmsys::SystemTools::GetFilenameName((string *)((long)&localcopy.field_2 + 8),pbVar14);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_1ce0,"GEN_WDIR",&local_1ce1);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1ce0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)local_1cc0,pcVar5,&local_1ce2);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ce2);
        std::__cxx11::string::~string((string *)&local_1ce0);
        std::allocator<char>::~allocator((allocator<char> *)&local_1ce1);
        std::__cxx11::string::operator+=((string *)local_1cc0,"/");
        std::__cxx11::string::operator+=
                  ((string *)local_1cc0,(string *)(localcopy.field_2._M_local_buf + 8));
        pbVar14 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&local_1c78);
        bVar2 = cmsys::SystemTools::CopyFileIfDifferent(pbVar14,(string *)local_1cc0);
        if (bVar2) {
          std::__cxx11::string::operator+=(local_938," ./");
          std::__cxx11::string::operator+=(local_938,(string *)(localcopy.field_2._M_local_buf + 8))
          ;
        }
        std::__cxx11::string::~string((string *)local_1cc0);
        std::__cxx11::string::~string((string *)(localcopy.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_1c78);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1c48);
    }
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1d08,"GEN_WDIR",(allocator *)(tmpFile_1.field_2._M_local_buf + 0xf))
    ;
    pcVar11 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1d08);
    bVar2 = cmSystemTools::RunSingleCommand
                      (pcVar5,(string *)&res,(string *)&res,&local_12cc,pcVar11,
                       (this->super_cmCPackGenerator).GeneratorVerbose,0.0);
    local_12d0 = (uint)bVar2;
    std::__cxx11::string::~string((string *)&local_1d08);
    std::allocator<char>::~allocator((allocator<char> *)(tmpFile_1.field_2._M_local_buf + 0xf));
    if ((local_12d0 == 0) || (local_12cc != 0)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_1d50,"CPACK_TOPLEVEL_DIRECTORY",(allocator *)&ofs_1.field_0x247);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_1d50);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d30,pcVar5,(allocator *)&ofs_1.field_0x246);
      std::allocator<char>::~allocator((allocator<char> *)&ofs_1.field_0x246);
      std::__cxx11::string::~string((string *)&local_1d50);
      std::allocator<char>::~allocator((allocator<char> *)&ofs_1.field_0x247);
      std::__cxx11::string::operator+=(local_1d30,"/Deb.log");
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmGeneratedFileStream::cmGeneratedFileStream((cmGeneratedFileStream *)local_1fa0,pcVar5,false)
      ;
      poVar6 = std::operator<<((ostream *)local_1fa0,"# Run command: ");
      poVar6 = std::operator<<(poVar6,local_938);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"# Working directory: ");
      poVar6 = std::operator<<(poVar6,(string *)&(this->super_cmCPackGenerator).toplevel);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"# Output:");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,(string *)&res);
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_2118);
      poVar6 = std::operator<<((ostream *)local_2118,"Problem running tar command: ");
      poVar6 = std::operator<<(poVar6,local_938);
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      poVar6 = std::operator<<(poVar6,"Please check ");
      poVar6 = std::operator<<(poVar6,local_1d30);
      poVar6 = std::operator<<(poVar6," for errors");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      pcVar1 = (this->super_cmCPackGenerator).Logger;
      std::__cxx11::ostringstream::str();
      pcVar5 = (char *)std::__cxx11::string::c_str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Source/CPack/cmCPackDebGenerator.cxx"
                      ,0x23b,pcVar5);
      std::__cxx11::string::~string
                ((string *)
                 &arFiles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_2118);
      this_local._4_4_ = 0;
      md5filename.field_2._12_4_ = 1;
      cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_1fa0);
      std::__cxx11::string::~string(local_1d30);
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&topLevelString.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2190,"GEN_WDIR",&local_2191);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2190);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_2170,pcVar5,&local_2192);
      std::allocator<char>::~allocator((allocator<char> *)&local_2192);
      std::__cxx11::string::~string((string *)&local_2190);
      std::allocator<char>::~allocator((allocator<char> *)&local_2191);
      std::__cxx11::string::operator+=((string *)local_2170,"/");
      std::operator+(&local_21b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170
                     ,"debian-binary");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_21b8);
      std::__cxx11::string::~string((string *)&local_21b8);
      std::operator+(&local_21d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170
                     ,"control.tar.gz");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_21d8);
      std::__cxx11::string::~string((string *)&local_21d8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outputFileName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2170
                     ,"data.tar");
      std::operator+(&local_21f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&outputFileName.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a00)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&topLevelString.field_2 + 8),&local_21f8);
      std::__cxx11::string::~string((string *)&local_21f8);
      std::__cxx11::string::~string((string *)(outputFileName.field_2._M_local_buf + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_2258,"CPACK_TOPLEVEL_DIRECTORY",&local_2259);
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2258);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_2238,pcVar5,&local_225a);
      std::allocator<char>::~allocator((allocator<char> *)&local_225a);
      std::__cxx11::string::~string((string *)&local_2258);
      std::allocator<char>::~allocator((allocator<char> *)&local_2259);
      std::__cxx11::string::operator+=(local_2238,"/");
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_2280,"CPACK_OUTPUT_FILE_NAME",
                 (allocator *)(tmpFile_2.field_2._M_local_buf + 0xf));
      pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_2280);
      std::__cxx11::string::operator+=(local_2238,pcVar5);
      std::__cxx11::string::~string((string *)&local_2280);
      std::allocator<char>::~allocator((allocator<char> *)(tmpFile_2.field_2._M_local_buf + 0xf));
      pcVar5 = (char *)std::__cxx11::string::c_str();
      local_12d0 = ar_append(pcVar5,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&topLevelString.field_2 + 8));
      bVar2 = local_12d0 == 0;
      if (bVar2) {
        md5filename.field_2._12_4_ = 1;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_22c8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                   (allocator *)&ofs_2.field_0x247);
        pcVar5 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_22c8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_22a8,pcVar5,(allocator *)&ofs_2.field_0x246);
        std::allocator<char>::~allocator((allocator<char> *)&ofs_2.field_0x246);
        std::__cxx11::string::~string((string *)&local_22c8);
        std::allocator<char>::~allocator((allocator<char> *)&ofs_2.field_0x247);
        std::__cxx11::string::operator+=(local_22a8,"/Deb.log");
        pcVar5 = (char *)std::__cxx11::string::c_str();
        cmGeneratedFileStream::cmGeneratedFileStream
                  ((cmGeneratedFileStream *)local_2518,pcVar5,false);
        poVar6 = std::operator<<((ostream *)local_2518,"# Problem creating archive using: ");
        pvVar9 = (void *)std::ostream::operator<<(poVar6,local_12d0);
        std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
        md5filename.field_2._12_4_ = 1;
        cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_2518);
        std::__cxx11::string::~string(local_22a8);
      }
      this_local._4_4_ = (uint)bVar2;
      std::__cxx11::string::~string(local_2238);
      std::__cxx11::string::~string((string *)local_2170);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&topLevelString.field_2 + 8));
    }
    std::__cxx11::string::~string(local_1748);
  }
  std::__cxx11::string::~string((string *)&res);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&fileIt_1);
  std::__cxx11::string::~string((string *)local_a00);
  std::__cxx11::string::~string((string *)local_9d8);
  std::__cxx11::string::~string((string *)local_9b0);
  std::__cxx11::string::~string(local_938);
  std::__cxx11::string::~string((string *)local_320);
  std::__cxx11::string::~string(local_2d8);
  std::__cxx11::string::~string(local_38);
  return this_local._4_4_;
}

Assistant:

int cmCPackDebGenerator::createDeb()
{
  // debian-binary file
  std::string dbfilename;
    dbfilename += this->GetOption("GEN_WDIR");
  dbfilename += "/debian-binary";
    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(dbfilename.c_str());
    out << "2.0";
    out << std::endl; // required for valid debian package
    }

  // control file
  std::string ctlfilename;
    ctlfilename = this->GetOption("GEN_WDIR");
  ctlfilename += "/control";

  // debian policy enforce lower case for package name
  // mandatory entries:
  std::string debian_pkg_name = cmsys::SystemTools::LowerCase(
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_NAME") );
  const char* debian_pkg_version =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_VERSION");
  const char* debian_pkg_section =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SECTION");
  const char* debian_pkg_priority =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PRIORITY");
  const char* debian_pkg_arch =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ARCHITECTURE");
  const char* maintainer =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_MAINTAINER");
  const char* desc =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DESCRIPTION");

  // optional entries
  const char* debian_pkg_dep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_DEPENDS");
  const char* debian_pkg_rec =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_RECOMMENDS");
  const char* debian_pkg_sug =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_SUGGESTS");
  const char* debian_pkg_url =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_HOMEPAGE");
  const char* debian_pkg_predep =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PREDEPENDS");
  const char* debian_pkg_enhances =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_ENHANCES");
  const char* debian_pkg_breaks =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_BREAKS");
  const char* debian_pkg_conflicts =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONFLICTS");
  const char* debian_pkg_provides =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_PROVIDES");
  const char* debian_pkg_replaces =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_REPLACES");

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(ctlfilename.c_str());
    out << "Package: " << debian_pkg_name << "\n";
    out << "Version: " << debian_pkg_version << "\n";
    out << "Section: " << debian_pkg_section << "\n";
    out << "Priority: " << debian_pkg_priority << "\n";
    out << "Architecture: " << debian_pkg_arch << "\n";
    if(debian_pkg_dep && *debian_pkg_dep)
      {
      out << "Depends: " << debian_pkg_dep << "\n";
      }
    if(debian_pkg_rec && *debian_pkg_rec)
      {
      out << "Recommends: " << debian_pkg_rec << "\n";
      }
    if(debian_pkg_sug && *debian_pkg_sug)
      {
      out << "Suggests: " << debian_pkg_sug << "\n";
      }
    if(debian_pkg_url && *debian_pkg_url)
      {
      out << "Homepage: " << debian_pkg_url << "\n";
      }
    if (debian_pkg_predep && *debian_pkg_predep)
      {
      out << "Pre-Depends: " << debian_pkg_predep << "\n";
      }
    if (debian_pkg_enhances && *debian_pkg_enhances)
      {
      out << "Enhances: " << debian_pkg_enhances << "\n";
      }
    if (debian_pkg_breaks && *debian_pkg_breaks)
      {
      out << "Breaks: " << debian_pkg_breaks << "\n";
      }
    if (debian_pkg_conflicts && *debian_pkg_conflicts)
      {
      out << "Conflicts: " << debian_pkg_conflicts << "\n";
      }
    if (debian_pkg_provides && *debian_pkg_provides)
      {
      out << "Provides: " << debian_pkg_provides << "\n";
      }
    if (debian_pkg_replaces && *debian_pkg_replaces)
      {
      out << "Replaces: " << debian_pkg_replaces << "\n";
      }
    unsigned long totalSize = 0;
    {
      std::string dirName = this->GetOption("CPACK_TEMPORARY_DIRECTORY");
      dirName += '/';
        for (std::vector<std::string>::const_iterator fileIt =
              packageFiles.begin();
              fileIt != packageFiles.end(); ++ fileIt )
        {
        totalSize += cmSystemTools::FileLength(*fileIt);
        }
    }
    out << "Installed-Size: " << (totalSize + 1023) / 1024 << "\n";
    out << "Maintainer: " << maintainer << "\n";
    out << "Description: " << desc << "\n";
    out << std::endl;
    }

  std::string cmd(this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE"));

  const char* debian_compression_type =
      this->GetOption("GEN_CPACK_DEBIAN_COMPRESSION_TYPE");
  if(!debian_compression_type)
    {
    debian_compression_type = "gzip";
    }

  std::string cmake_tar = " ", compression_modifier = "a", compression_suffix;
  if(!strcmp(debian_compression_type, "lzma")) {
      compression_suffix = ".lzma";
  } else if(!strcmp(debian_compression_type, "xz")) {
      compression_suffix = ".xz";
  } else if(!strcmp(debian_compression_type, "bzip2")) {
      compression_suffix = ".bz2";
      compression_modifier = "j";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "gzip")) {
      compression_suffix = ".gz";
      compression_modifier = "z";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else if(!strcmp(debian_compression_type, "none")) {
      compression_suffix = "";
      compression_modifier = "";
      cmake_tar += "\"" + cmSystemTools::GetCMakeCommand() + "\" -E ";
  } else {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Error unrecognized compression type: "
                    << debian_compression_type << std::endl);
  }

  cmd += cmake_tar + "tar c" + compression_modifier + "f data.tar"
      + compression_suffix;

  // now add all directories which have to be compressed
  // collect all top level install dirs for that
  // e.g. /opt/bin/foo, /usr/bin/bar and /usr/bin/baz would give /usr and /opt
    size_t topLevelLength = std::string(this->GetOption("GEN_WDIR")).length();
    cmCPackLogger(cmCPackLog::LOG_DEBUG, "WDIR: \""
          << this->GetOption("GEN_WDIR")
          << "\", length = " << topLevelLength
          << std::endl);
  std::set<std::string> installDirs;
    for (std::vector<std::string>::const_iterator fileIt =
        packageFiles.begin();
        fileIt != packageFiles.end(); ++ fileIt )
    {
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "FILEIT: \"" << *fileIt << "\""
          << std::endl);
    std::string::size_type slashPos = fileIt->find('/', topLevelLength+1);
    std::string relativeDir = fileIt->substr(topLevelLength,
                                             slashPos - topLevelLength);
      cmCPackLogger(cmCPackLog::LOG_DEBUG, "RELATIVEDIR: \"" << relativeDir
      << "\"" << std::endl);
    if (installDirs.find(relativeDir) == installDirs.end())
      {
      installDirs.insert(relativeDir);
      cmd += " .";
      cmd += relativeDir;
      }
    }

  std::string output;
    int retval = -1;
  int res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  std::string md5filename;
    md5filename = this->GetOption("GEN_WDIR");
  md5filename += "/md5sums";

    { // the scope is needed for cmGeneratedFileStream
    cmGeneratedFileStream out(md5filename.c_str());
    std::vector<std::string>::const_iterator fileIt;
//       std::string topLevelWithTrailingSlash = toplevel;
    std::string topLevelWithTrailingSlash =
        this->GetOption("CPACK_TEMPORARY_DIRECTORY");
    topLevelWithTrailingSlash += '/';
      for ( fileIt = packageFiles.begin();
            fileIt != packageFiles.end(); ++ fileIt )
      {
      cmd = "\"";
      cmd += cmSystemTools::GetCMakeCommand();
      cmd += "\" -E md5sum \"";
      cmd += *fileIt;
      cmd += "\"";
      //std::string output;
      //int retVal = -1;
      res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
          &retval, toplevel.c_str(), this->GeneratorVerbose, 0);
      if ( !res || retval )
        {
        cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running cmake -E md5sum "
                      << cmd << std::endl);
        }
      // debian md5sums entries are like this:
      // 014f3604694729f3bf19263bac599765  usr/bin/ccmake
      // thus strip the full path (with the trailing slash)
      cmSystemTools::ReplaceString(output,
                                   topLevelWithTrailingSlash.c_str(), "");
      out << output;
      }
    // each line contains a eol.
    // Do not end the md5sum file with yet another (invalid)
    }

    // set md5sum file permissins to RW-R--R-- so that deb lintian doesn't warn
    // about it
    cmSystemTools::SetPermissions(md5filename.c_str(),
        S_IRUSR | S_IWUSR | S_IRGRP | S_IROTH);

    cmd = this->GetOption("GEN_CPACK_DEBIAN_FAKEROOT_EXECUTABLE");
    cmd += cmake_tar + "tar czf control.tar.gz ./control ./md5sums";
    const char* controlExtra =
      this->GetOption("GEN_CPACK_DEBIAN_PACKAGE_CONTROL_EXTRA");
  if( controlExtra )
    {
    std::vector<std::string> controlExtraList;
    cmSystemTools::ExpandListArgument(controlExtra, controlExtraList);
    for(std::vector<std::string>::iterator i =
          controlExtraList.begin(); i != controlExtraList.end(); ++i)
      {
      std::string filenamename =
        cmsys::SystemTools::GetFilenameName(*i);
      std::string localcopy = this->GetOption("GEN_WDIR");
      localcopy += "/";
      localcopy += filenamename;
      // if we can copy the file, it means it does exist, let's add it:
      if( cmsys::SystemTools::CopyFileIfDifferent(
            *i, localcopy) )
        {
        // debian is picky and need relative to ./ path in the tar.*
        cmd += " ./";
        cmd += filenamename;
        }
      }
    }
  res = cmSystemTools::RunSingleCommand(cmd.c_str(), &output, &output,
      &retval, this->GetOption("GEN_WDIR"), this->GeneratorVerbose, 0);

    if ( !res || retval )
    {
    std::string tmpFile = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Run command: " << cmd << std::endl
      << "# Working directory: " << toplevel << std::endl
      << "# Output:" << std::endl
      << output << std::endl;
    cmCPackLogger(cmCPackLog::LOG_ERROR, "Problem running tar command: "
      << cmd << std::endl
      << "Please check " << tmpFile << " for errors" << std::endl);
    return 0;
    }

  // ar -r your-package-name.deb debian-binary control.tar.* data.tar.*
  // since debian packages require BSD ar (most Linux distros and even
  // FreeBSD and NetBSD ship GNU ar) we use a copy of OpenBSD ar here.
  std::vector<std::string> arFiles;
    std::string topLevelString = this->GetOption("GEN_WDIR");
  topLevelString += "/";
  arFiles.push_back(topLevelString + "debian-binary");
  arFiles.push_back(topLevelString + "control.tar.gz");
  arFiles.push_back(topLevelString + "data.tar" + compression_suffix);
    std::string outputFileName = this->GetOption("CPACK_TOPLEVEL_DIRECTORY");
    outputFileName += "/";
    outputFileName += this->GetOption("CPACK_OUTPUT_FILE_NAME");
    res = ar_append(outputFileName.c_str(), arFiles);
  if ( res!=0 )
    {
    std::string tmpFile = this->GetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME");
    tmpFile += "/Deb.log";
    cmGeneratedFileStream ofs(tmpFile.c_str());
    ofs << "# Problem creating archive using: " << res << std::endl;
    return 0;
    }
  return 1;
}